

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_lee_2021_brts_no_zeroinit.h
# Opt level: O2

void __thiscall BRTS_XZ<UFPC>::PerformLabeling(BRTS_XZ<UFPC> *this)

{
  Data_Compressed *this_00;
  undefined8 uVar1;
  ushort uVar2;
  ushort uVar3;
  uint uVar4;
  int _width;
  Mat1b *pMVar5;
  Mat1i *pMVar6;
  uint *puVar7;
  Run *pRVar8;
  ulong uVar9;
  long lVar10;
  Run *pRVar11;
  long lVar12;
  ulong uVar13;
  Size local_98;
  Mat local_90 [96];
  
  pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  uVar4 = *(uint *)&pMVar5->field_0x8;
  _width = *(int *)&pMVar5->field_0xc;
  this_00 = &this->data_compressed;
  Data_Compressed::Alloc(this_00,uVar4,_width);
  InitCompressedData(this,this_00);
  Runs::Alloc(&this->data_runs,uVar4,_width);
  uVar1 = *(undefined8 *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x8;
  UFPC::Alloc((((int)((ulong)uVar1 >> 0x20) + 1) / 2) * (((int)uVar1 + 1) / 2) + 1);
  *UFPC::P_ = 0;
  UFPC::length_ = 1;
  FindRuns(this,(this->data_compressed).bits,uVar4,(this->data_compressed).data_width,
           (this->data_runs).runs);
  pRVar11 = (this->data_runs).runs;
  uVar1 = **(undefined8 **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x40;
  local_98.height = (int)uVar1;
  local_98.width = (int)((ulong)uVar1 >> 0x20);
  cv::Mat_<int>::Mat_((Mat_<int> *)local_90,&local_98);
  cv::Mat::operator=(&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat,
                     local_90);
  cv::Mat::~Mat(local_90);
  pMVar6 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  uVar9 = 0;
  uVar13 = (ulong)uVar4;
  if ((int)uVar4 < 1) {
    uVar13 = uVar9;
  }
  for (; puVar7 = UFPC::P_, uVar9 != uVar13; uVar9 = uVar9 + 1) {
    lVar10 = **(long **)&pMVar6->field_0x48 * uVar9 + *(long *)&pMVar6->field_0x10;
    lVar12 = 0;
    pRVar8 = pRVar11;
    do {
      pRVar11 = pRVar8;
      uVar2 = pRVar11->start_pos;
      lVar12 = (long)(int)lVar12;
      if ((ulong)uVar2 == 0xffff) {
        for (; lVar12 < _width; lVar12 = lVar12 + 1) {
          *(undefined4 *)(lVar10 + lVar12 * 4) = 0;
        }
        pRVar11 = pRVar11 + 1;
      }
      else {
        uVar3 = pRVar11->end_pos;
        uVar4 = puVar7[pRVar11->label];
        for (; lVar12 < (long)(ulong)uVar2; lVar12 = lVar12 + 1) {
          *(undefined4 *)(lVar10 + lVar12 * 4) = 0;
        }
        for (; lVar12 < (long)(ulong)uVar3; lVar12 = lVar12 + 1) {
          *(uint *)(lVar10 + lVar12 * 4) = uVar4;
        }
      }
      pRVar8 = pRVar11 + 1;
    } while (uVar2 != 0xffff);
  }
  UFPC::Dealloc();
  Runs::Dealloc(&this->data_runs);
  Data_Compressed::Dealloc(this_00);
  return;
}

Assistant:

void PerformLabeling()
    {
        int w(img_.cols);
        int h(img_.rows);

        data_compressed.Alloc(h, w);
        InitCompressedData(data_compressed);

        //find runs
        data_runs.Alloc(h, w);
        LabelsSolver::Alloc(UPPER_BOUND_8_CONNECTIVITY);
        LabelsSolver::Setup();
        FindRuns(data_compressed.bits, h, data_compressed.data_width, data_runs.runs);

        Run* runs = data_runs.runs;
        img_labels_ = cv::Mat1i(img_.size());
        for (int i = 0; i < h; i++) {
            unsigned* const labels = img_labels_.ptr<unsigned>(i);
            for (int j = 0;; runs++) {
                unsigned short start_pos = runs->start_pos;
                if (start_pos == 0xFFFF) {
                    for (; j < w; j++) labels[j] = 0;
                    runs++;
                    break;
                }
                unsigned short end_pos = runs->end_pos;
                int label = LabelsSolver::GetLabel(runs->label);
                for (; j < start_pos; j++) labels[j] = 0;
                for (; j < end_pos; j++) labels[j] = label;
            }
        }

        LabelsSolver::Dealloc();
        data_runs.Dealloc();
        data_compressed.Dealloc();
    }